

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_txfm.h
# Opt level: O0

int get_rect_tx_log_ratio(int col,int row)

{
  int row_local;
  int col_local;
  
  if (col == row) {
    return 0;
  }
  if (row < col) {
    if (col == row * 2) {
      return 1;
    }
    if (col == row << 2) {
      return 2;
    }
  }
  else {
    if (row == col * 2) {
      return -1;
    }
    if (row == col << 2) {
      return -2;
    }
  }
  return 0;
}

Assistant:

static inline int get_rect_tx_log_ratio(int col, int row) {
  if (col == row) return 0;
  if (col > row) {
    if (col == row * 2) return 1;
    if (col == row * 4) return 2;
    assert(0 && "Unsupported transform size");
  } else {
    if (row == col * 2) return -1;
    if (row == col * 4) return -2;
    assert(0 && "Unsupported transform size");
  }
  return 0;  // Invalid
}